

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

void ReadVectorFromFile<xLearn::Node>
               (FILE *file_ptr,vector<xLearn::Node,_std::allocator<xLearn::Node>_> *vec)

{
  ostream *poVar1;
  ostream *poVar2;
  long in_RDI;
  size_t in_stack_000000c8;
  char *in_stack_000000d0;
  FILE *in_stack_000000d8;
  size_t len;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffe58;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  int line;
  string *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  LogSeverity severity;
  undefined1 local_f0 [31];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [36];
  Logger local_84;
  ulong local_80;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14 [5];
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  if (in_RDI == 0) {
    Logger::Logger(local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"ReadVectorFromFile",&local_71);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffed8,line,in_stack_fffffffffffffec8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x11c);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"file_ptr");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe60);
    abort();
  }
  local_80 = 0;
  ReadDataFromDisk(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  if (local_80 == 0) {
    Logger::Logger(&local_84,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"ReadVectorFromFile",&local_d1);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffed8,line,in_stack_fffffffffffffec8);
    poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x120);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"len");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_80);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"0");
    poVar2 = std::operator<<(poVar1," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    Logger::~Logger((Logger *)poVar1);
    abort();
  }
  memset(local_f0,0,0x18);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::vector
            ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x21257c);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::swap
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::~vector(in_stack_fffffffffffffe60);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::resize
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::data
            ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x2125cc);
  ReadDataFromDisk(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  return;
}

Assistant:

void ReadVectorFromFile(FILE *file_ptr, std::vector<T> &vec) {
  CHECK_NOTNULL(file_ptr);
  // First, read the length of vector
  size_t len = 0;
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  CHECK_GT(len, 0);
  // Clear the original vector
  std::vector<T>().swap(vec);
  vec.resize(len);
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(vec.data()), sizeof(T)*len);
}